

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::INC_ZP_X(CPU *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  this->cycles = 6;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 2;
  uVar3 = (uint)(byte)((char)iVar2 + this->X);
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar3);
  bVar1 = (char)iVar2 + 1;
  this->cycles = this->cycles - 2;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)uVar3,(ulong)bVar1);
  this->cycles = this->cycles - 1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::INC_ZP_X()
{
    cycles = 6;
    uint8_t addr = GetByte() + X, result = ReadByte(addr) + 1;
    cycles -= 2;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}